

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O2

void __thiscall benchmark::CSVReporter::PrintRunData(CSVReporter *this,Run *run)

{
  ostream *poVar1;
  double dVar2;
  allocator local_9a;
  allocator local_99;
  double local_98;
  double local_90;
  string label;
  string local_68;
  string local_48;
  string name;
  
  local_98 = run->cpu_accumulated_time * 1000000000.0;
  local_90 = run->real_accumulated_time * 1000000000.0;
  if (run->iterations != 0) {
    dVar2 = (double)run->iterations;
    local_90 = local_90 / dVar2;
    local_98 = local_98 / dVar2;
  }
  std::__cxx11::string::string((string *)&name,(string *)run);
  std::__cxx11::string::string((string *)&label,"\"",(allocator *)&local_48);
  std::__cxx11::string::string((string *)&local_68,"\"\"",&local_9a);
  ReplaceAll(&name,&label,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&label);
  poVar1 = std::operator<<((ostream *)&std::cout,"\"");
  poVar1 = std::operator<<(poVar1,(string *)&name);
  std::operator<<(poVar1,"\",");
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(local_90);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(local_98);
  std::operator<<(poVar1,",");
  if (0.0 < run->bytes_per_second) {
    std::ostream::_M_insert<double>(run->bytes_per_second);
  }
  std::operator<<((ostream *)&std::cout,",");
  if (0.0 < run->items_per_second) {
    std::ostream::_M_insert<double>(run->items_per_second);
  }
  std::operator<<((ostream *)&std::cout,",");
  if ((run->report_label)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&label,(string *)&run->report_label);
    std::__cxx11::string::string((string *)&local_68,"\"",&local_9a);
    std::__cxx11::string::string((string *)&local_48,"\"\"",&local_99);
    ReplaceAll(&label,&local_68,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    poVar1 = std::operator<<((ostream *)&std::cout,"\"");
    poVar1 = std::operator<<(poVar1,(string *)&label);
    std::operator<<(poVar1,"\"");
    std::__cxx11::string::~string((string *)&label);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void CSVReporter::PrintRunData(Run const& run) {
  double const multiplier = 1e9;  // nano second multiplier
  double cpu_time = run.cpu_accumulated_time * multiplier;
  double real_time = run.real_accumulated_time * multiplier;
  if (run.iterations != 0) {
    real_time = real_time / static_cast<double>(run.iterations);
    cpu_time = cpu_time / static_cast<double>(run.iterations);
  }

  // Field with embedded double-quote characters must be doubled and the field
  // delimited with double-quotes.
  std::string name = run.benchmark_name;
  ReplaceAll(&name, "\"", "\"\"");
  std::cout << "\"" << name << "\",";

  std::cout << run.iterations << ",";
  std::cout << real_time << ",";
  std::cout << cpu_time << ",";

  if (run.bytes_per_second > 0.0) {
    std::cout << run.bytes_per_second;
  }
  std::cout << ",";
  if (run.items_per_second > 0.0) {
    std::cout << run.items_per_second;
  }
  std::cout << ",";
  if (!run.report_label.empty()) {
    // Field with embedded double-quote characters must be doubled and the field
    // delimited with double-quotes.
    std::string label = run.report_label;
    ReplaceAll(&label, "\"", "\"\"");
    std::cout << "\"" << label << "\"";
  }
  std::cout << '\n';
}